

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O1

string * __thiscall
bssl::(anonymous_namespace)::CertErrorParams2SizeT::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  size_type *psVar1;
  char *__s;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  __s = *(char **)((long)this + 8);
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,": ","");
  strlen(__s);
  plVar2 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,(ulong)__s);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_120 = *puVar4;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar4;
    local_130 = (ulong *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  string_util::NumberToDecimalString_abi_cxx11_
            (&local_90,(string_util *)(ulong)*(uint *)((long)this + 0x10),(int)local_128);
  uVar6 = 0xf;
  if (local_130 != &local_120) {
    uVar6 = local_120;
  }
  if (uVar6 < local_90._M_string_length + local_128) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar7 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_90._M_string_length + local_128) goto LAB_004c6382;
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_004c6382:
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_90._M_dataplus._M_p);
  }
  local_110 = &local_100;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_100 = *plVar2;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *plVar2;
    local_110 = (long *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_110);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_70);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_e0 = *puVar4;
    uStack_d8 = (undefined4)plVar2[3];
    uStack_d4 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar4;
    local_f0 = (ulong *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_d0 = local_c0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,": ","");
  uVar6 = 0xf;
  if (local_f0 != &local_e0) {
    uVar6 = local_e0;
  }
  if (uVar6 < (ulong)(local_c8 + local_e8)) {
    uVar6 = 0xf;
    if (local_d0 != local_c0) {
      uVar6 = local_c0[0];
    }
    if (uVar6 < (ulong)(local_c8 + local_e8)) goto LAB_004c6516;
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_004c6516:
    puVar3 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0);
  }
  local_150 = &local_140;
  puVar4 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar4) {
    local_140 = *puVar4;
    uStack_138 = puVar3[3];
  }
  else {
    local_140 = *puVar4;
    local_150 = (ulong *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = puVar4;
  puVar3[1] = 0;
  *(undefined1 *)puVar4 = 0;
  string_util::NumberToDecimalString_abi_cxx11_
            (&local_b0,(string_util *)(ulong)*(uint *)((long)this + 0x20),(int)(puVar3 + 1));
  uVar6 = 0xf;
  if (local_150 != &local_140) {
    uVar6 = local_140;
  }
  if (uVar6 < local_b0._M_string_length + local_148) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar7 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_148 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
      goto LAB_004c6605;
    }
  }
  puVar3 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0._M_dataplus._M_p);
LAB_004c6605:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar7 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToDebugString() const override {
    return name1_ + std::string(": ") +
           bssl::string_util::NumberToDecimalString(value1_) + "\n" + name2_ +
           std::string(": ") +
           bssl::string_util::NumberToDecimalString(value2_);
  }